

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

void caffe::ReadSolverParamsFromTextFileOrDie(string *param_file,SolverParameter *param)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  null_stream local_1a;
  null_stream local_19;
  SolverParameter *local_18;
  SolverParameter *param_local;
  string *param_file_local;
  
  local_18 = param;
  param_local = (SolverParameter *)param_file;
  null_stream::operator<<(&local_1a,"Failed to parse SolverParameter file: ");
  std::__cxx11::string::string((string *)&local_40,(string *)param_local);
  null_stream::operator<<(&local_19,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  UpgradeSolverAsNeeded((string *)param_local,local_18);
  return;
}

Assistant:

void ReadSolverParamsFromTextFileOrDie(const string& param_file,
                                       SolverParameter* param) {
  CHECK(ReadProtoFromTextFile(param_file, param))
      << "Failed to parse SolverParameter file: " << param_file;
  UpgradeSolverAsNeeded(param_file, param);
}